

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

_Bool upb_MiniTable_Link(upb_MiniTable *m,upb_MiniTable **sub_tables,size_t sub_table_count,
                        upb_MiniTableEnum **sub_enums,size_t sub_enum_count)

{
  _Bool _Var1;
  upb_CType uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int i;
  upb_MiniTableField *f;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  
  lVar4 = 0;
  uVar9 = 0;
  sVar7 = 0;
  do {
    uVar3 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only;
    if (uVar3 <= uVar9) {
      lVar4 = 0;
      uVar6 = 0;
      uVar9 = 0;
      do {
        if (uVar3 <= uVar6) {
          return uVar9 == sub_enum_count && sVar7 == sub_table_count;
        }
        uVar5 = uVar9;
        if ((&m->fields_dont_copy_me__upb_internal_use_only->
              descriptortype_dont_copy_me__upb_internal_use_only)[lVar4] == '\x0e') {
          uVar5 = (ulong)((int)uVar9 + 1);
          if (sub_enum_count < uVar5) {
            return false;
          }
          if (sub_enums[uVar9] != (upb_MiniTableEnum *)0x0) {
            _Var1 = upb_MiniTable_SetSubEnum
                              (m,(upb_MiniTableField *)
                                 ((long)&m->fields_dont_copy_me__upb_internal_use_only->
                                         number_dont_copy_me__upb_internal_use_only + lVar4),
                               sub_enums[uVar9]);
            if (!_Var1) {
              return false;
            }
            uVar3 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only;
          }
        }
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + 0xc;
        uVar9 = uVar5;
      } while( true );
    }
    f = (upb_MiniTableField *)
        ((long)&m->fields_dont_copy_me__upb_internal_use_only->
                number_dont_copy_me__upb_internal_use_only + lVar4);
    uVar2 = upb_MiniTableField_CType(f);
    sVar8 = sVar7;
    if (uVar2 == kUpb_CType_Message) {
      sVar8 = (size_t)((int)sVar7 + 1);
      if (sub_table_count < sVar8) {
        return false;
      }
      if ((sub_tables[sVar7] != (upb_MiniTable *)0x0) &&
         (_Var1 = upb_MiniTable_SetSubMessage(m,f,sub_tables[sVar7]), !_Var1)) {
        return false;
      }
    }
    uVar9 = uVar9 + 1;
    lVar4 = lVar4 + 0xc;
    sVar7 = sVar8;
  } while( true );
}

Assistant:

bool upb_MiniTable_Link(upb_MiniTable* m, const upb_MiniTable** sub_tables,
                        size_t sub_table_count,
                        const upb_MiniTableEnum** sub_enums,
                        size_t sub_enum_count) {
  uint32_t msg_count = 0;
  uint32_t enum_count = 0;

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    upb_MiniTableField* f =
        (upb_MiniTableField*)upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_CType(f) == kUpb_CType_Message) {
      const upb_MiniTable* sub = sub_tables[msg_count++];
      if (msg_count > sub_table_count) return false;
      if (sub && !upb_MiniTable_SetSubMessage(m, f, sub)) return false;
    }
  }

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    upb_MiniTableField* f =
        (upb_MiniTableField*)upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_IsClosedEnum(f)) {
      const upb_MiniTableEnum* sub = sub_enums[enum_count++];
      if (enum_count > sub_enum_count) return false;
      if (sub && !upb_MiniTable_SetSubEnum(m, f, sub)) return false;
    }
  }

  return (msg_count == sub_table_count) && (enum_count == sub_enum_count);
}